

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGenerator::CreateQtAutoGeneratorsTargets(cmGlobalGenerator *this,AutogensType *autogens)

{
  cmMakefile *pcVar1;
  bool bVar2;
  pointer ppcVar3;
  cmTarget *this_00;
  ulong uVar4;
  byte bVar5;
  __node_base *p_Var6;
  string *name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targetNames;
  cmQtAutoGenerators autogen;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b18;
  vector<std::pair<cmQtAutoGenerators,cmTarget_const*>,std::allocator<std::pair<cmQtAutoGenerators,cmTarget_const*>>>
  *local_af8;
  cmQtAutoGenerators local_af0;
  cmQtAutoGenerators local_760;
  cmTarget *local_3d0;
  pair<cmQtAutoGenerators,_const_cmTarget_*> local_3c8;
  
  ppcVar3 = (this->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar3) {
    uVar4 = 0;
    local_af8 = (vector<std::pair<cmQtAutoGenerators,cmTarget_const*>,std::allocator<std::pair<cmQtAutoGenerators,cmTarget_const*>>>
                 *)autogens;
    do {
      pcVar1 = ppcVar3[uVar4]->Makefile;
      local_b18.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_b18.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_b18.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&local_b18,(pcVar1->Targets)._M_h._M_element_count);
      p_Var6 = &(pcVar1->Targets)._M_h._M_before_begin;
      while (p_Var6 = p_Var6->_M_nxt,
            name = local_b18.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start, p_Var6 != (__node_base *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_b18,(value_type *)(p_Var6 + 0x3a));
      }
      for (; name != local_b18.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; name = name + 1) {
        this_00 = cmMakefile::FindTarget
                            ((this->LocalGenerators).
                             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar4]->Makefile,name,true);
        if (this_00->TargetTypeValue < UTILITY) {
          local_3c8.first.QtMajorVersion._M_dataplus._M_p =
               (pointer)&local_3c8.first.QtMajorVersion.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"AUTOMOC","");
          bVar2 = cmTarget::GetPropertyAsBool(this_00,(string *)&local_3c8);
          if (bVar2) {
            bVar5 = this_00->IsImportedTarget ^ 1;
          }
          else {
            local_760.QtMajorVersion._M_dataplus._M_p = (pointer)&local_760.QtMajorVersion.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_760,"AUTOUIC","");
            bVar2 = cmTarget::GetPropertyAsBool(this_00,&local_760.QtMajorVersion);
            if (bVar2) {
              bVar5 = this_00->IsImportedTarget ^ 1;
            }
            else {
              local_af0.QtMajorVersion._M_dataplus._M_p = (pointer)&local_af0.QtMajorVersion.field_2
              ;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_af0,"AUTORCC","");
              bVar2 = cmTarget::GetPropertyAsBool(this_00,&local_af0.QtMajorVersion);
              if (bVar2) {
                bVar5 = this_00->IsImportedTarget ^ 1;
              }
              else {
                bVar5 = 0;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_af0.QtMajorVersion._M_dataplus._M_p != &local_af0.QtMajorVersion.field_2)
              {
                operator_delete(local_af0.QtMajorVersion._M_dataplus._M_p,
                                local_af0.QtMajorVersion.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_760.QtMajorVersion._M_dataplus._M_p != &local_760.QtMajorVersion.field_2) {
              operator_delete(local_760.QtMajorVersion._M_dataplus._M_p,
                              local_760.QtMajorVersion.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8.first.QtMajorVersion._M_dataplus._M_p !=
              &local_3c8.first.QtMajorVersion.field_2) {
            operator_delete(local_3c8.first.QtMajorVersion._M_dataplus._M_p,
                            local_3c8.first.QtMajorVersion.field_2._M_allocated_capacity + 1);
          }
          if (bVar5 != 0) {
            cmQtAutoGenerators::cmQtAutoGenerators(&local_af0);
            bVar2 = cmQtAutoGenerators::InitializeAutogenTarget(&local_af0,this_00);
            if (bVar2) {
              cmQtAutoGenerators::cmQtAutoGenerators(&local_760,&local_af0);
              local_3d0 = this_00;
              cmQtAutoGenerators::cmQtAutoGenerators(&local_3c8.first,&local_760);
              local_3c8.second = local_3d0;
              std::
              vector<std::pair<cmQtAutoGenerators,cmTarget_const*>,std::allocator<std::pair<cmQtAutoGenerators,cmTarget_const*>>>
              ::emplace_back<std::pair<cmQtAutoGenerators,cmTarget_const*>>(local_af8,&local_3c8);
              cmQtAutoGenerators::~cmQtAutoGenerators(&local_3c8.first);
              cmQtAutoGenerators::~cmQtAutoGenerators(&local_760);
            }
            cmQtAutoGenerators::~cmQtAutoGenerators(&local_af0);
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b18);
      uVar4 = (ulong)((int)uVar4 + 1);
      ppcVar3 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->LocalGenerators).
                                   super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar3 >> 3))
    ;
  }
  return;
}

Assistant:

void cmGlobalGenerator::CreateQtAutoGeneratorsTargets(AutogensType &autogens)
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  for(unsigned int i=0; i < this->LocalGenerators.size(); ++i)
    {
    cmTargets& targets =
      this->LocalGenerators[i]->GetMakefile()->GetTargets();
    std::vector<std::string> targetNames;
    targetNames.reserve(targets.size());
    for(cmTargets::iterator ti = targets.begin();
        ti != targets.end(); ++ti)
      {
      targetNames.push_back(ti->second.GetName());
      }
    for(std::vector<std::string>::iterator ti = targetNames.begin();
        ti != targetNames.end(); ++ti)
      {
      cmTarget& target = *this->LocalGenerators[i]
                              ->GetMakefile()->FindTarget(*ti, true);
      if(target.GetType() == cmTarget::EXECUTABLE ||
         target.GetType() == cmTarget::STATIC_LIBRARY ||
         target.GetType() == cmTarget::SHARED_LIBRARY ||
         target.GetType() == cmTarget::MODULE_LIBRARY ||
         target.GetType() == cmTarget::OBJECT_LIBRARY)
        {
        if((target.GetPropertyAsBool("AUTOMOC")
              || target.GetPropertyAsBool("AUTOUIC")
              || target.GetPropertyAsBool("AUTORCC"))
            && !target.IsImported())
          {
          cmQtAutoGenerators autogen;
          if(autogen.InitializeAutogenTarget(&target))
            {
            autogens.push_back(std::make_pair(autogen, &target));
            }
          }
        }
      }
    }
#else
  (void)autogens;
#endif
}